

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.c++
# Opt level: O0

void __thiscall capnp::compiler::Compiler::Impl::Impl(Impl *this,AnnotationFlag annotationFlag)

{
  bool bVar1;
  uint16_t uVar2;
  uint64_t uVar3;
  Node *pNVar4;
  mapped_type *ppNVar5;
  Own<capnp::compiler::Compiler::Node,_std::nullptr_t> *other;
  mapped_type *this_00;
  Iterator IVar6;
  Reader RVar7;
  StringPtr SVar8;
  Iterator IVar9;
  undefined1 local_2c0 [8];
  Own<capnp::compiler::Compiler::Node,_std::nullptr_t> newNode;
  Which which;
  Reader local_278;
  ReaderFor<capnp::List<capnp::compiler::Declaration::BrandParameter,_(capnp::Kind)3>_> local_258;
  undefined1 local_228 [8];
  Reader annotation;
  undefined1 local_1e8 [8];
  Iterator __end5;
  undefined1 local_1c8 [8];
  Iterator __begin5;
  Reader *__range5;
  Reader params;
  StringPtr symbolName;
  undefined1 local_130 [8];
  Reader name;
  Reader fieldProto;
  Field field;
  undefined1 local_a0 [8];
  Iterator __end2;
  undefined1 local_80 [8];
  Iterator __begin2;
  FieldList *__range2;
  StructSchema declSchema;
  AnnotationFlag annotationFlag_local;
  Impl *this_local;
  
  SchemaLoader::LazyLoadCallback::LazyLoadCallback(&this->super_LazyLoadCallback);
  (this->super_LazyLoadCallback)._vptr_LazyLoadCallback = (_func_int **)&PTR_load_00d92ff8;
  this->annotationFlag = annotationFlag;
  kj::Arena::Arena(&this->nodeArena,0x400);
  std::
  unordered_map<capnp::compiler::Module_*,_kj::Own<capnp::compiler::Compiler::CompiledModule,_std::nullptr_t>,_std::hash<capnp::compiler::Module_*>,_std::equal_to<capnp::compiler::Module_*>,_std::allocator<std::pair<capnp::compiler::Module_*const,_kj::Own<capnp::compiler::Compiler::CompiledModule,_std::nullptr_t>_>_>_>
  ::unordered_map(&this->modules);
  Workspace::Workspace(&this->workspace,&this->super_LazyLoadCallback);
  std::
  unordered_map<unsigned_long,_capnp::compiler::Compiler::Node_*,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_capnp::compiler::Compiler::Node_*>_>_>
  ::unordered_map(&this->nodesById);
  std::
  unordered_map<unsigned_long,_capnp::schema::Node::SourceInfo::Reader,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_capnp::schema::Node::SourceInfo::Reader>_>_>
  ::unordered_map(&this->sourceInfoById);
  std::
  map<kj::StringPtr,_kj::Own<capnp::compiler::Compiler::Node,_std::nullptr_t>,_std::less<kj::StringPtr>,_std::allocator<std::pair<const_kj::StringPtr,_kj::Own<capnp::compiler::Compiler::Node,_std::nullptr_t>_>_>_>
  ::map(&this->builtinDecls);
  std::
  map<capnp::compiler::Declaration::Which,_capnp::compiler::Compiler::Node_*,_std::less<capnp::compiler::Declaration::Which>,_std::allocator<std::pair<const_capnp::compiler::Declaration::Which,_capnp::compiler::Compiler::Node_*>_>_>
  ::map(&this->builtinDeclsByKind);
  this->nextBogusId = 1000;
  __range2 = (FieldList *)Schema::from<capnp::compiler::Declaration>();
  StructSchema::getFields((FieldList *)&__begin2.index,(StructSchema *)&__range2);
  IVar6 = StructSchema::FieldList::begin((FieldList *)&__begin2.index);
  __end2._8_8_ = IVar6.container;
  __begin2.container._0_4_ = IVar6.index;
  local_80 = (undefined1  [8])__end2._8_8_;
  IVar6 = StructSchema::FieldList::end((FieldList *)&__begin2.index);
  local_a0 = (undefined1  [8])IVar6.container;
  __end2.container._0_4_ = IVar6.index;
  do {
    bVar1 = capnp::_::
            IndexingIterator<const_capnp::StructSchema::FieldList,_capnp::StructSchema::Field>::
            operator==((IndexingIterator<const_capnp::StructSchema::FieldList,_capnp::StructSchema::Field>
                        *)local_80,
                       (IndexingIterator<const_capnp::StructSchema::FieldList,_capnp::StructSchema::Field>
                        *)local_a0);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      return;
    }
    capnp::_::IndexingIterator<const_capnp::StructSchema::FieldList,_capnp::StructSchema::Field>::
    operator*((Field *)&fieldProto._reader.nestingLimit,
              (IndexingIterator<const_capnp::StructSchema::FieldList,_capnp::StructSchema::Field> *)
              local_80);
    StructSchema::Field::getProto
              ((Reader *)&name.super_StringPtr.content.size_,
               (Field *)&fieldProto._reader.nestingLimit);
    uVar2 = capnp::schema::Field::Reader::getDiscriminantValue
                      ((Reader *)&name.super_StringPtr.content.size_);
    if (uVar2 != 0xffff) {
      RVar7 = capnp::schema::Field::Reader::getName((Reader *)&name.super_StringPtr.content.size_);
      name.super_StringPtr.content.ptr = RVar7.super_StringPtr.content.size_;
      local_130 = RVar7.super_StringPtr.content.ptr;
      kj::StringPtr::StringPtr((StringPtr *)&symbolName.content.size_,"builtin");
      bVar1 = kj::StringPtr::startsWith
                        ((StringPtr *)local_130,(StringPtr *)&symbolName.content.size_);
      if (bVar1) {
        SVar8 = kj::StringPtr::slice((StringPtr *)local_130,7);
        symbolName.content.ptr = (char *)SVar8.content.size_;
        params.reader._40_8_ = SVar8.content.ptr;
        List<capnp::compiler::Declaration::BrandParameter,_(capnp::Kind)3>::Reader::Reader
                  ((Reader *)&__range5);
        capnp::schema::Field::Reader::getAnnotations
                  ((Reader *)&__begin5.index,(Reader *)&name.super_StringPtr.content.size_);
        IVar9 = List<capnp::schema::Annotation,_(capnp::Kind)3>::Reader::begin
                          ((Reader *)&__begin5.index);
        __end5._8_8_ = IVar9.container;
        __begin5.container._0_4_ = IVar9.index;
        local_1c8 = (undefined1  [8])__end5._8_8_;
        IVar9 = List<capnp::schema::Annotation,_(capnp::Kind)3>::Reader::end
                          ((Reader *)&__begin5.index);
        annotation._reader._40_8_ = IVar9.container;
        __end5.container._0_4_ = IVar9.index;
        local_1e8 = (undefined1  [8])annotation._reader._40_8_;
        while (bVar1 = capnp::_::
                       IndexingIterator<const_capnp::List<capnp::schema::Annotation,_(capnp::Kind)3>::Reader,_capnp::schema::Annotation::Reader>
                       ::operator==((IndexingIterator<const_capnp::List<capnp::schema::Annotation,_(capnp::Kind)3>::Reader,_capnp::schema::Annotation::Reader>
                                     *)local_1c8,
                                    (IndexingIterator<const_capnp::List<capnp::schema::Annotation,_(capnp::Kind)3>::Reader,_capnp::schema::Annotation::Reader>
                                     *)local_1e8), ((bVar1 ^ 0xffU) & 1) != 0) {
          capnp::_::
          IndexingIterator<const_capnp::List<capnp::schema::Annotation,_(capnp::Kind)3>::Reader,_capnp::schema::Annotation::Reader>
          ::operator*((Reader *)local_228,
                      (IndexingIterator<const_capnp::List<capnp::schema::Annotation,_(capnp::Kind)3>::Reader,_capnp::schema::Annotation::Reader>
                       *)local_1c8);
          uVar3 = capnp::schema::Annotation::Reader::getId((Reader *)local_228);
          if (uVar3 == 0x94099c3f9eb32d6b) {
            capnp::schema::Annotation::Reader::getValue
                      ((Reader *)&stack0xfffffffffffffd58,(Reader *)local_228);
            capnp::schema::Value::Reader::getList(&local_278,(Reader *)&stack0xfffffffffffffd58);
            AnyPointer::Reader::
            getAs<capnp::List<capnp::compiler::Declaration::BrandParameter,(capnp::Kind)3>>
                      (&local_258,&local_278);
            memcpy(&__range5,&local_258,0x30);
            break;
          }
          capnp::_::
          IndexingIterator<const_capnp::List<capnp::schema::Annotation,_(capnp::Kind)3>::Reader,_capnp::schema::Annotation::Reader>
          ::operator++((IndexingIterator<const_capnp::List<capnp::schema::Annotation,_(capnp::Kind)3>::Reader,_capnp::schema::Annotation::Reader>
                        *)local_1c8);
        }
        newNode.ptr._6_2_ =
             capnp::schema::Field::Reader::getDiscriminantValue
                       ((Reader *)&name.super_StringPtr.content.size_);
        kj::Arena::
        allocateOwn<capnp::compiler::Compiler::Node,kj::StringPtr&,capnp::compiler::Declaration::Which&,capnp::List<capnp::compiler::Declaration::BrandParameter,(capnp::Kind)3>::Reader&>
                  ((Arena *)local_2c0,(StringPtr *)&this->nodeArena,
                   (Which *)&params.reader.nestingLimit,(Reader *)((long)&newNode.ptr + 6));
        pNVar4 = kj::Own::operator_cast_to_Node_((Own *)local_2c0);
        ppNVar5 = std::
                  map<capnp::compiler::Declaration::Which,_capnp::compiler::Compiler::Node_*,_std::less<capnp::compiler::Declaration::Which>,_std::allocator<std::pair<const_capnp::compiler::Declaration::Which,_capnp::compiler::Compiler::Node_*>_>_>
                  ::operator[](&this->builtinDeclsByKind,(key_type *)((long)&newNode.ptr + 6));
        *ppNVar5 = pNVar4;
        other = kj::mv<kj::Own<capnp::compiler::Compiler::Node,decltype(nullptr)>>
                          ((Own<capnp::compiler::Compiler::Node,_std::nullptr_t> *)local_2c0);
        this_00 = std::
                  map<kj::StringPtr,_kj::Own<capnp::compiler::Compiler::Node,_std::nullptr_t>,_std::less<kj::StringPtr>,_std::allocator<std::pair<const_kj::StringPtr,_kj::Own<capnp::compiler::Compiler::Node,_std::nullptr_t>_>_>_>
                  ::operator[](&this->builtinDecls,(key_type *)&params.reader.nestingLimit);
        kj::Own<capnp::compiler::Compiler::Node,_std::nullptr_t>::operator=(this_00,other);
        kj::Own<capnp::compiler::Compiler::Node,_std::nullptr_t>::~Own
                  ((Own<capnp::compiler::Compiler::Node,_std::nullptr_t> *)local_2c0);
      }
    }
    capnp::_::IndexingIterator<const_capnp::StructSchema::FieldList,_capnp::StructSchema::Field>::
    operator++((IndexingIterator<const_capnp::StructSchema::FieldList,_capnp::StructSchema::Field> *
               )local_80);
  } while( true );
}

Assistant:

Compiler::Impl::Impl(AnnotationFlag annotationFlag)
    : annotationFlag(annotationFlag), workspace(*this) {
  // Reflectively interpret the members of Declaration.body.  Any member prefixed by "builtin"
  // defines a builtin declaration visible in the global scope.

  StructSchema declSchema = Schema::from<Declaration>();
  for (auto field: declSchema.getFields()) {
    auto fieldProto = field.getProto();
    if (fieldProto.getDiscriminantValue() != schema::Field::NO_DISCRIMINANT) {
      auto name = fieldProto.getName();
      if (name.startsWith("builtin")) {
        kj::StringPtr symbolName = name.slice(strlen("builtin"));

        List<Declaration::BrandParameter>::Reader params;
        for (auto annotation: fieldProto.getAnnotations()) {
          if (annotation.getId() == 0x94099c3f9eb32d6bull) {
            params = annotation.getValue().getList().getAs<List<Declaration::BrandParameter>>();
            break;
          }
        }

        Declaration::Which which =
            static_cast<Declaration::Which>(fieldProto.getDiscriminantValue());
        kj::Own<Node> newNode = nodeArena.allocateOwn<Node>(symbolName, which, params);
        builtinDeclsByKind[which] = newNode;
        builtinDecls[symbolName] = kj::mv(newNode);
      }
    }
  }
}